

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
::~MapEntryImpl(MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
                *this)

{
  Arena *pAVar1;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
  *this_local;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MapEntryImpl_00d52130;
  if ((this != this->default_instance_) &&
     (pAVar1 = GetArenaNoVirtual(this), pAVar1 == (Arena *)0x0)) {
    MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)3,_long>::DeleteNoArena
              (&this->key_);
    MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)1,_double>::DeleteNoArena
              (&this->value_);
  }
  MessageLite::~MessageLite(&this->super_MessageLite);
  return;
}

Assistant:

~MapEntryImpl() {
    if (this != default_instance_) {
      if (GetArenaNoVirtual() != NULL) return;
      KeyTypeHandler::DeleteNoArena(key_);
      ValueTypeHandler::DeleteNoArena(value_);
    }
  }